

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O3

fdb_kvs_handle * scan(storage_t *st,fdb_kvs_handle *reuse_kv)

{
  char *__s1;
  fdb_status fVar1;
  int iVar2;
  fdb_kvs_handle *pfVar3;
  undefined4 extraout_var_00;
  fdb_kvs_handle *markers_out;
  list_elem **unaff_RBP;
  fdb_kvs_handle *handle_in;
  fdb_file_handle *fhandle;
  fdb_doc *doc;
  list *plVar4;
  long lVar5;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_kvs_handle *snap_kv;
  idx_prams_t params;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_108;
  uint64_t uStackY_100;
  fdb_kvs_handle *pfStackY_f8;
  fdb_kvs_handle *pfStackY_f0;
  code *pcStackY_e8;
  fdb_file_handle *pfStackY_d8;
  fdb_kvs_handle *pfStackY_d0;
  timeval tStackY_c8;
  fdb_kvs_handle *pfStackY_b8;
  fdb_doc *local_78;
  fdb_iterator *local_70;
  undefined1 local_68 [56];
  undefined4 extraout_var;
  
  gettimeofday((timeval *)(local_68 + 0x28),(__timezone_ptr_t)0x0);
  local_78 = (fdb_doc *)0x0;
  gen_index_params((idx_prams_t *)(local_68 + 0x10));
  if (reuse_kv != (fdb_kvs_handle *)0x0) {
    fVar1 = fdb_snapshot_open(reuse_kv,(fdb_kvs_handle **)local_68,0xffffffffffffffff);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00109f77;
    scan_cold_1();
  }
  handle_in = st->index1;
  pfVar3 = (fdb_kvs_handle *)local_68;
  fVar1 = fdb_snapshot_open(handle_in,(fdb_kvs_handle **)pfVar3,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    scan_cold_2();
    pcStackY_e8 = (code *)0x10a070;
    pfStackY_b8 = reuse_kv;
    gettimeofday(&tStackY_c8,(__timezone_ptr_t)0x0);
    fhandle = *(fdb_file_handle **)&handle_in->kvs_config;
    markers_out = (fdb_kvs_handle *)&pfStackY_d8;
    pcStackY_e8 = (code *)0x10a082;
    fVar1 = fdb_get_all_snap_markers
                      (fhandle,(fdb_snapshot_info_t **)markers_out,(uint64_t *)&pfStackY_d0);
    pfStackY_f0 = handle_in;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (pfStackY_d0 != (fdb_kvs_handle *)0x0) {
        lVar5 = 0;
        do {
          plVar4 = (&pfStackY_d8->handles)[lVar5 * 3];
          if (0 < (long)plVar4) {
            unaff_RBP = &(&pfStackY_d8->cmp_func_list)[lVar5 * 3]->tail;
            do {
              pcStackY_e8 = (code *)0x10a0c2;
              iVar2 = strcmp((char *)((list *)(unaff_RBP + -1))->head,(char *)pfVar3);
              if (iVar2 == 0) goto LAB_0010a0eb;
              unaff_RBP = unaff_RBP + 2;
              plVar4 = (list *)((long)&plVar4[-1].tail + 7);
            } while (plVar4 != (list *)0x0);
          }
          lVar5 = lVar5 + 1;
        } while ((fdb_kvs_handle *)lVar5 != pfStackY_d0);
      }
      pcStackY_e8 = (code *)0x10a0e2;
      markers_out = pfStackY_d0;
      fhandle = pfStackY_d8;
      fVar1 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStackY_d8,(uint64_t)pfStackY_d0);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcStackY_e8 = (code *)0x10a0eb;
        last_snap_seqnum();
LAB_0010a0eb:
        pfVar3 = (fdb_kvs_handle *)*unaff_RBP;
        pcStackY_e8 = (code *)0x10a0fa;
        markers_out = pfStackY_d0;
        fVar1 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStackY_d8,(uint64_t)pfStackY_d0);
        fhandle = pfStackY_d8;
        if (fVar1 == FDB_RESULT_SUCCESS) {
          return pfVar3;
        }
      }
      pcStackY_e8 = (code *)0x10a115;
      last_snap_seqnum();
      pfStackY_f0 = pfStackY_d0;
    }
    pcStackY_e8 = print_n_markers;
    last_snap_seqnum();
    pfStackY_f8 = pfVar3;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)fhandle->root,&pfStackY_108,&uStackY_100);
    pfVar3 = (fdb_kvs_handle *)CONCAT44(extraout_var,fVar1);
    if (markers_out != (fdb_kvs_handle *)0x0) {
      lVar5 = 0x10;
      do {
        iVar2 = printf("marker:  %lu\n",
                       *(undefined8 *)(*(long *)((long)&pfStackY_108->marker + lVar5) + 8));
        pfVar3 = (fdb_kvs_handle *)CONCAT44(extraout_var_00,iVar2);
        lVar5 = lVar5 + 0x18;
        markers_out = (fdb_kvs_handle *)((long)&markers_out[-1].bub_ctx.handle + 7);
      } while (markers_out != (fdb_kvs_handle *)0x0);
    }
    return pfVar3;
  }
LAB_00109f77:
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)local_68._0_8_,&local_70,local_68 + 0x10,0xc,
                            local_68 + 0x1c,0xc,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    do {
      fVar1 = fdb_iterator_get(local_70,&local_78);
      doc = local_78;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        __s1 = (char *)local_78->key;
        iVar2 = strcmp(__s1,local_68 + 0x10);
        if ((iVar2 < 0) || (iVar2 = strcmp(__s1,local_68 + 0x1c), 0 < iVar2)) {
          scan_cold_3();
          doc = (fdb_doc *)local_68._8_8_;
        }
        fdb_doc_free(doc);
        local_78 = (fdb_doc *)0x0;
      }
      fVar1 = fdb_iterator_next(local_70);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  }
  fdb_iterator_close(local_70);
  return (fdb_kvs_handle *)local_68._0_8_;
}

Assistant:

fdb_kvs_handle * scan(storage_t *st, fdb_kvs_handle *reuse_kv)
{
    TEST_INIT();

    fdb_kvs_handle *snap_kv;
    idx_prams_t params;
    fdb_status status;
    fdb_iterator *it;
    fdb_doc *rdoc = NULL;

    // generate params
    gen_index_params(&params);

    // create new snapkv or reuse current
    if(reuse_kv){
        status = fdb_snapshot_open(reuse_kv, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_snapshot_open(st->index1, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapkv
    status = fdb_iterator_init(snap_kv, &it, params.min, 12,
                               params.max, 12, FDB_ITR_NONE);
    if (status == FDB_RESULT_SUCCESS) {
        do {
            status = fdb_iterator_get(it, &rdoc);
            if (status == FDB_RESULT_SUCCESS){

                // make sure every doc is within requested range
                TEST_CHK(((strcmp((char *)rdoc->key,params.min) >= 0) &&
                       (strcmp((char *)rdoc->key, params.max) <= 0)));
                fdb_doc_free(rdoc);
                rdoc=NULL;
            }
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    }

    fdb_iterator_close(it);

    return snap_kv;
}